

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_module_name.cpp
# Opt level: O0

void __thiscall sc_core::sc_module_name::~sc_module_name(sc_module_name *this)

{
  sc_object_manager *this_00;
  sc_module *this_01;
  sc_module *in_RDI;
  sc_module_name *smn;
  int in_stack_00000064;
  char *in_stack_00000068;
  char *in_stack_00000070;
  char *in_stack_00000078;
  sc_severity in_stack_00000084;
  
  if (((ulong)(in_RDI->super_sc_object).m_child_events.
              super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage & 1) != 0) {
    this_00 = sc_simcontext::get_object_manager
                        ((sc_simcontext *)
                         (in_RDI->super_sc_object).m_child_events.
                         super__Vector_base<sc_core::sc_event_*,_std::allocator<sc_core::sc_event_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    this_01 = (sc_module *)sc_object_manager::pop_module_name(this_00);
    if (in_RDI != this_01) {
      sc_report_handler::report
                (in_stack_00000084,in_stack_00000078,in_stack_00000070,in_stack_00000068,
                 in_stack_00000064);
    }
    if ((sc_module *)(in_RDI->super_sc_object).m_attr_cltn_p != (sc_module *)0x0) {
      sc_module::end_module(this_01);
    }
  }
  return;
}

Assistant:

sc_module_name::~sc_module_name()
{
    if( m_pushed ) {
        sc_module_name* smn = m_simc->get_object_manager()->pop_module_name();
        if( this != smn ) {
            SC_REPORT_ERROR( SC_ID_SC_MODULE_NAME_USE_, 0 );
        }
	if ( m_module_p ) m_module_p->end_module();
    }
}